

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O3

t_pvalue * __thiscall xemmai::t_context::f_variable(t_context *this,wstring_view a_name)

{
  const_iterator cVar1;
  long lVar2;
  _Base_ptr p_Var3;
  t_object *ptVar4;
  t_pvalue *ptVar5;
  long lVar6;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_28;
  
  local_28._M_str = a_name._M_str;
  local_28._M_len = a_name._M_len;
  ptVar4 = this->v_lambda;
  lVar2 = *(long *)(ptVar4->v_data + 8);
  cVar1 = std::
          _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
          ::_M_find_tr<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                    ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                      *)(lVar2 + 0xb0),&local_28);
  if (cVar1._M_node == (_Base_ptr)(lVar2 + 0xb8)) {
    return (t_pvalue *)0x0;
  }
  if (local_28._M_len == 0) {
    p_Var3 = cVar1._M_node[2]._M_parent;
LAB_0013473c:
    if ((char)cVar1._M_node[2]._M_color != _S_black) {
      ptVar5 = this->v_base;
      goto LAB_00134750;
    }
    ptVar4 = this->v_scope;
  }
  else {
    lVar2 = local_28._M_len << 2;
    lVar6 = 0;
    do {
      if (local_28._M_str[lVar6] != L':') {
        p_Var3 = cVar1._M_node[2]._M_parent;
        if (lVar6 != 0) goto LAB_00134724;
        goto LAB_0013473c;
      }
      lVar6 = lVar6 + 1;
      lVar2 = lVar2 + -4;
    } while (lVar2 != 0);
    p_Var3 = cVar1._M_node[2]._M_parent;
LAB_00134724:
    ptVar4 = *(t_object **)ptVar4->v_data;
    if (lVar6 != 1) {
      lVar6 = lVar6 + -1;
      do {
        ptVar4 = *(t_object **)(ptVar4->v_data + 8);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  ptVar5 = (t_pvalue *)(ptVar4->v_data + 0x10);
LAB_00134750:
  return ptVar5 + (long)p_Var3;
}

Assistant:

const t_pvalue* t_context::f_variable(std::wstring_view a_name) const
{
	auto& lambda = v_lambda->f_as<t_lambda>();
	auto& code = lambda.v_code->f_as<t_code>();
	auto i = code.v_variables.find(a_name);
	if (i == code.v_variables.end()) return nullptr;
	size_t outer = 0;
	for (auto i = a_name.begin(); i != a_name.end() && *i == L':'; ++i) ++outer;
	size_t index = i->second.v_index;
	if (outer <= 0) return (i->second.v_shared ? reinterpret_cast<const t_pvalue*>(v_scope->f_as<t_scope>().f_entries()) : v_base) + index;
	t_object* scope = lambda.v_scope;
	for (size_t i = 1; i < outer; ++i) scope = scope->f_as<t_scope>().f_outer();
	return reinterpret_cast<const t_pvalue*>(scope->f_as<t_scope>().f_entries()) + index;
}